

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

int __thiscall
QRegularExpressionPrivate::captureIndexForName(QRegularExpressionPrivate *this,QAnyStringView name)

{
  undefined1 *puVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 str;
  long in_FS_OFFSET;
  QAnyStringView rhs;
  uint namedCapturingTableEntrySize;
  uint namedCapturingTableEntryCount;
  PCRE2_SPTR16 *namedCapturingTable;
  int local_48;
  uint local_44;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->compiledPattern != (pcre2_code_16 *)0x0) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_44 = 0xaaaaaaaa;
    local_48 = -0x55555556;
    pcre2_pattern_info_16(this->compiledPattern,0x13);
    pcre2_pattern_info_16(this->compiledPattern,0x11,&local_44);
    pcre2_pattern_info_16(this->compiledPattern,0x12,&local_48);
    uVar4 = 0xffffffff;
    if (local_44 == 0) goto LAB_003fc36c;
    uVar4 = 0;
    do {
      puVar1 = local_40;
      uVar5 = local_48 * uVar4;
      str.m_data = local_40 + (ulong)uVar5 * 2 + 2;
      uVar3 = QtPrivate::qustrlen(str.m_data_utf16);
      rhs.m_size = uVar3 | 0x8000000000000000;
      rhs.field_0.m_data = str.m_data;
      bVar2 = QAnyStringView::equal(name,rhs);
      if (bVar2) {
        uVar4 = (uint)*(ushort *)(puVar1 + (ulong)uVar5 * 2);
        goto LAB_003fc36c;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_44);
  }
  uVar4 = 0xffffffff;
LAB_003fc36c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

int QRegularExpressionPrivate::captureIndexForName(QAnyStringView name) const
{
    Q_ASSERT(!name.isEmpty());

    if (!compiledPattern)
        return -1;

    // See the other usages of pcre2_pattern_info_16 for more details about this
    PCRE2_SPTR16 *namedCapturingTable;
    unsigned int namedCapturingTableEntryCount;
    unsigned int namedCapturingTableEntrySize;

    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NAMETABLE, &namedCapturingTable);
    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NAMECOUNT, &namedCapturingTableEntryCount);
    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NAMEENTRYSIZE, &namedCapturingTableEntrySize);

    for (unsigned int i = 0; i < namedCapturingTableEntryCount; ++i) {
        const auto currentNamedCapturingTableRow =
                reinterpret_cast<const char16_t *>(namedCapturingTable) + namedCapturingTableEntrySize * i;

        if (name == (currentNamedCapturingTableRow + 1)) {
            const int index = *currentNamedCapturingTableRow;
            return index;
        }
    }

    return -1;
}